

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O3

ptr<Value> __thiscall Operation::getResult(Operation *this,ptr<Value> *left,ptr<Value> *right)

{
  element_type *peVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  Operation OVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 *puVar14;
  undefined4 *puVar15;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar17;
  ptr<Value> pVar18;
  ptr<Value> object;
  string local_98;
  Operation local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_30;
  
  peVar1 = (right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) || (*in_RCX == 0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Both operands must have a value","");
    ExceptionObjects::null_value((ExceptionObjects *)&local_68,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    *puVar14 = local_68;
    puVar14[1] = local_60;
    __cxa_throw(puVar14,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  this->_vptr_Operation = (_func_int **)0x0;
  this[1]._vptr_Operation = (_func_int **)0x0;
  iVar10 = (*(peVar1->super_Member)._vptr_Member[8])();
  iVar11 = (**(code **)(*(long *)*in_RCX + 0x40))();
  if (iVar10 < iVar11) {
    iVar11 = iVar10;
  }
  switch(iVar11) {
  case 1:
    (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member).
      _vptr_Member[2])(&local_98);
    (**(code **)(*(long *)*in_RCX + 0x10))(&local_68);
    (*(code *)(((left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member)
              ._vptr_Member)(&local_78,left,&local_98,&local_68);
    p_Var5 = p_Stack_70;
    OVar4._vptr_Operation = local_78._vptr_Operation;
    local_78._vptr_Operation = (_func_int **)0x0;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->_vptr_Operation = (_func_int **)OVar4;
    this[1]._vptr_Operation = (_func_int **)p_Var5;
    _Var16._M_pi = extraout_RDX;
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
      _Var16._M_pi = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      _Var16._M_pi = extraout_RDX_01;
    }
    goto LAB_0011ecb7;
  case 2:
    (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member).
      _vptr_Member[4])();
    local_30 = extraout_XMM0_Da;
    uVar17 = (**(code **)(*(long *)*in_RCX + 0x20))();
    (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].super_Member.
              _vptr_Member)(local_30,uVar17,&local_98,left);
    _Var16._M_pi = extraout_RDX_05;
    break;
  case 3:
    iVar11 = (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Member)._vptr_Member[3])();
    uVar13 = (**(code **)(*(long *)*in_RCX + 0x18))();
    (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[2].super_Member.
              _vptr_Member)(&local_98,left,iVar11,uVar13);
    _Var16._M_pi = extraout_RDX_03;
    break;
  case 4:
    uVar12 = (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Member)._vptr_Member[5])();
    uVar9 = (**(code **)(*(long *)*in_RCX + 0x28))();
    (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[3].super_Member.
              _vptr_Member)(&local_98,left,uVar12 & 0xff,uVar9);
    _Var16._M_pi = extraout_RDX_04;
    break;
  case 5:
    (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member).
      _vptr_Member[6])(&local_68);
    (**(code **)(*(long *)*in_RCX + 0x30))(&local_78);
    (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[4].super_Member.
              _vptr_Member)(&local_98,left,&local_68,&local_78);
    _Var16._M_pi = extraout_RDX_02;
    goto LAB_0011ec8b;
  case 6:
    (*(((right->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member).
      _vptr_Member[7])(&local_68);
    (**(code **)(*(long *)*in_RCX + 0x38))(&local_78);
    (*(code *)(left->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[5].super_Member.
              _vptr_Member)(&local_98,left,&local_68,&local_78);
    _Var16._M_pi = extraout_RDX_06;
LAB_0011ec8b:
    sVar3 = local_98._M_string_length;
    _Var2._M_p = local_98._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    this->_vptr_Operation = (_func_int **)_Var2._M_p;
    this[1]._vptr_Operation = (_func_int **)sVar3;
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      _Var16._M_pi = extraout_RDX_07;
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      _Var16._M_pi = extraout_RDX_08;
    }
    goto LAB_0011ecb7;
  default:
    puVar15 = (undefined4 *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Types are not operable!","");
    ExceptionObjects::undefined_operation((ExceptionObjects *)&local_48,&local_98);
    uVar17 = (undefined4)local_48;
    uVar6 = local_48._4_4_;
    uVar7 = (undefined4)uStack_40;
    uVar8 = uStack_40._4_4_;
    local_48 = 0;
    uStack_40 = 0;
    *puVar15 = uVar17;
    puVar15[1] = uVar6;
    puVar15[2] = uVar7;
    puVar15[3] = uVar8;
    __cxa_throw(puVar15,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  this->_vptr_Operation = (_func_int **)local_98._M_dataplus._M_p;
  this[1]._vptr_Operation = (_func_int **)local_98._M_string_length;
LAB_0011ecb7:
  pVar18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var16._M_pi;
  pVar18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> Operation::getResult(ptr<Value> &left, ptr<Value> &right) {
    if(!left || !right) {
        ptr<Value> object = ExceptionObjects::null_value("Both operands must have a value");
        throw ThrowPacket(object);
    }

    ptr<Value> result;
    Type type = getGreaterType(left, right);

    switch(type) {
        case Type::String:
            result = asStrings(left -> asString(), right -> asString());
            break;
        case Type::Object:
            result = asObjects(left -> asObject(), right -> asObject());
            break;
        case Type::Array:
            result = asArrays(left -> asArray(), right -> asArray());
            break;
        case Type::Double:
            result = asDoubles(left -> asDouble(), right -> asDouble());
            break;
        case Type::Integer:
            result = asIntegers(left -> asInteger(), right -> asInteger());
            break;
        case Type::Boolean:
            result = asBooleans(left -> asBoolean(), right -> asBoolean());
            break;
        default:
            throw ThrowPacket(ExceptionObjects::undefined_operation("Types are not operable!"));
    }
    return result;
}